

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O2

data_type * __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::text_grid::data_type>::allocate_array
          (memory_manager_stateless_kernel_1<dlib::text_grid::data_type> *this,unsigned_long size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  unsigned_long *puVar4;
  long lVar5;
  data_type *this_00;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x58),0);
  uVar3 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar3 = 0xffffffffffffffff;
  }
  uVar2 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x58),8) == 0) {
    uVar2 = uVar3;
  }
  puVar4 = (unsigned_long *)operator_new__(uVar2);
  *puVar4 = size;
  if (size != 0) {
    lVar5 = 0;
    this_00 = (data_type *)(puVar4 + 1);
    do {
      text_grid::data_type::data_type(this_00);
      lVar5 = lVar5 + -0x58;
      this_00 = this_00 + 1;
    } while (size * -0x58 - lVar5 != 0);
  }
  return (data_type *)(puVar4 + 1);
}

Assistant:

T* allocate_array (
                unsigned long size
            ) 
            { 
                return new T[size];
            }